

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

int ParseExpMinMax(char **p,aint *nval)

{
  int iVar1;
  int iVar2;
  int iVar3;
  aint right;
  int local_40;
  int local_3c;
  int *local_38;
  
  iVar1 = ParseExpShift(p,&local_3c);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    local_38 = nval;
    iVar2 = need(p,"<?>?");
    iVar1 = local_3c;
    if (iVar2 != 0) {
      do {
        iVar3 = ParseExpShift(p,&local_40);
        if (iVar3 == 0) {
          return 0;
        }
        if (iVar2 == 0x7d) {
          if (iVar1 <= local_40) {
            iVar1 = local_40;
          }
        }
        else if (iVar2 == 0x7b) {
          if (local_40 <= iVar1) {
            iVar1 = local_40;
          }
        }
        else {
          Error("internal error",(char *)0x0,FATAL);
        }
        iVar2 = need(p,"<?>?");
      } while (iVar2 != 0);
    }
    *local_38 = iVar1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int ParseExpMinMax(char*& p, aint& nval) {
	aint left, right;
	int oper;
	if (!ParseExpShift(p, left)) return 0;
	while ((oper = need(p, "<?>?"))) {
		if (!ParseExpShift(p, right)) return 0;
		switch (oper) {
		case '<'+'?':
			left = left < right ? left : right; break;
		case '>'+'?':
			left = left > right ? left : right; break;
		default: Error("internal error", nullptr, FATAL); break;	// unreachable
		}
	}
	nval = left;
	return 1;
}